

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

VariableStruct * __thiscall
adios2::core::IO::InquireStructVariable
          (IO *this,string *name,StructDefinition *def,bool allowReorganize)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  VariableStruct *pVVar4;
  size_t sVar5;
  size_t sVar6;
  ulong index;
  bool local_74;
  string local_70;
  string local_50;
  
  pVVar4 = InquireStructVariable(this,name);
  if (pVVar4 != (VariableStruct *)0x0) {
    sVar5 = StructDefinition::Fields(pVVar4->m_WriteStructDefinition);
    sVar6 = StructDefinition::Fields(def);
    if (sVar5 == sVar6) {
      local_74 = !allowReorganize;
      index = 0;
      do {
        sVar5 = StructDefinition::Fields(def);
        if (sVar5 <= index) {
          return pVVar4;
        }
        StructDefinition::Name_abi_cxx11_(&local_50,pVVar4->m_WriteStructDefinition,index);
        StructDefinition::Name_abi_cxx11_(&local_70,def,index);
        bVar1 = std::operator!=(&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) {
          return (VariableStruct *)0x0;
        }
        sVar5 = StructDefinition::Offset(pVVar4->m_WriteStructDefinition,index);
        sVar6 = StructDefinition::Offset(def,index);
        if (local_74 && sVar5 != sVar6) {
          return (VariableStruct *)0x0;
        }
        DVar2 = StructDefinition::Type(pVVar4->m_WriteStructDefinition,index);
        DVar3 = StructDefinition::Type(def,index);
        if (DVar2 != DVar3) {
          return (VariableStruct *)0x0;
        }
        sVar5 = StructDefinition::ElementCount(pVVar4->m_WriteStructDefinition,index);
        sVar6 = StructDefinition::ElementCount(def,index);
        index = index + 1;
      } while (sVar5 == sVar6);
    }
  }
  return (VariableStruct *)0x0;
}

Assistant:

VariableStruct *IO::InquireStructVariable(const std::string &name, const StructDefinition &def,
                                          const bool allowReorganize) noexcept
{
    auto ret = InquireStructVariable(name);
    if (ret == nullptr)
    {
        return nullptr;
    }

    if (ret->m_WriteStructDefinition->Fields() != def.Fields())
    {
        return nullptr;
    }

    for (size_t i = 0; i < def.Fields(); ++i)
    {
        if (ret->m_WriteStructDefinition->Name(i) != def.Name(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Offset(i) != def.Offset(i) && !allowReorganize)
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Type(i) != def.Type(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->ElementCount(i) != def.ElementCount(i))
        {
            return nullptr;
        }
    }

    return ret;
}